

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadBootStrap(CrateReader *this)

{
  int64_t *ret;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StreamReader *this_00;
  uint64_t uVar2;
  bool bVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  ulong *puVar8;
  long lVar9;
  int iVar10;
  char *pcVar11;
  undefined8 uVar12;
  ulong uVar13;
  _Alloc_hider _Var14;
  uchar *in_R9;
  uint uVar15;
  size_t nbytes;
  size_t sVar16;
  uint8_t version [8];
  uint8_t magic [8];
  string __str_1;
  string __str;
  ostringstream ss_e;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  byte local_260;
  byte local_25f;
  byte local_25e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  size_type local_238;
  string local_230;
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  uint8_t *local_1f0;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8 [2];
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this_00 = this->_sr;
  uVar2 = this_00->idx_;
  sVar16 = 8;
  if (this_00->length_ < uVar2 + 8) {
    sVar16 = this_00->length_ - uVar2;
  }
  if (sVar16 - 1 < 8) {
    memcpy(&local_238,this_00->binary_ + uVar2,sVar16);
    this_00->idx_ = this_00->idx_ + sVar16;
    if (sVar16 != 8) goto LAB_001ca607;
    if (local_238 == 0x434453552d525850) {
      uVar2 = this_00->idx_;
      sVar16 = 8;
      if (this_00->length_ < uVar2 + 8) {
        sVar16 = this_00->length_ - uVar2;
      }
      if (7 < sVar16 - 1) {
LAB_001ca83e:
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadBootStrap",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar10 = 0x1842;
        goto LAB_001ca683;
      }
      memcpy(&local_260,this_00->binary_ + uVar2,sVar16);
      this_00->idx_ = uVar2 + sVar16;
      if (sVar16 != 8) goto LAB_001ca83e;
      this->_version[0] = local_260;
      this->_version[1] = local_25f;
      this->_version[2] = local_25e;
      if (local_25f < 4 && local_260 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadBootStrap",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1851);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_1c8,'\x01');
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_1c8._M_dataplus._M_p,1,(uint)local_260);
        puVar5 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x3b973c);
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        psVar7 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_230.field_2._M_allocated_capacity = *psVar7;
          local_230.field_2._8_8_ = puVar5[3];
        }
        else {
          local_230.field_2._M_allocated_capacity = *psVar7;
          local_230._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_230._M_string_length = puVar5[1];
        *puVar5 = psVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        plVar6 = (long *)::std::__cxx11::string::append((char *)&local_230);
        puVar8 = (ulong *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_258.field_2._M_allocated_capacity = *puVar8;
          local_258.field_2._8_8_ = plVar6[3];
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        }
        else {
          local_258.field_2._M_allocated_capacity = *puVar8;
          local_258._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_258._M_string_length = plVar6[1];
        *plVar6 = (long)puVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        uVar15 = 1;
        if (9 < local_25f) {
          uVar15 = 3 - (local_25f < 100);
        }
        local_210 = local_200;
        ::std::__cxx11::string::_M_construct((ulong)&local_210,(char)uVar15);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_210,uVar15,(uint)local_25f);
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          uVar12 = local_258.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_208 + local_258._M_string_length) {
          uVar13 = 0xf;
          if (local_210 != local_200) {
            uVar13 = local_200[0];
          }
          if (uVar13 < local_208 + local_258._M_string_length) goto LAB_001cadcd;
          puVar5 = (undefined8 *)
                   ::std::__cxx11::string::replace
                             ((ulong)&local_210,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p);
        }
        else {
LAB_001cadcd:
          puVar5 = (undefined8 *)
                   ::std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_210);
        }
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        psVar7 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_280.field_2._M_allocated_capacity = *psVar7;
          local_280.field_2._8_8_ = puVar5[3];
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar7;
          local_280._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_280._M_string_length = puVar5[1];
        *puVar5 = psVar7;
        puVar5[1] = 0;
        *(undefined1 *)psVar7 = 0;
        plVar6 = (long *)::std::__cxx11::string::append((char *)&local_280);
        paVar1 = &local_2a0.field_2;
        puVar8 = (ulong *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_2a0.field_2._M_allocated_capacity = *puVar8;
          local_2a0.field_2._8_8_ = plVar6[3];
          local_2a0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *puVar8;
          local_2a0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2a0._M_string_length = plVar6[1];
        *plVar6 = (long)puVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        uVar15 = 1;
        if (9 < local_25e) {
          uVar15 = 3 - (local_25e < 100);
        }
        local_1e8 = local_1d8;
        ::std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)uVar15);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e8,uVar15,(uint)local_25e);
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != paVar1) {
          uVar12 = local_2a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_1e0 + local_2a0._M_string_length) {
          uVar13 = 0xf;
          if (local_1e8 != local_1d8) {
            uVar13 = local_1d8[0];
          }
          if (uVar13 < local_1e0 + local_2a0._M_string_length) goto LAB_001cafcb;
          puVar5 = (undefined8 *)
                   ::std::__cxx11::string::replace
                             ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_2a0._M_dataplus._M_p);
        }
        else {
LAB_001cafcb:
          puVar5 = (undefined8 *)
                   ::std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_1e8);
        }
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        psVar7 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_2c0.field_2._M_allocated_capacity = *psVar7;
          local_2c0.field_2._8_8_ = puVar5[3];
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *psVar7;
          local_2c0._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_2c0._M_string_length = puVar5[1];
        *puVar5 = psVar7;
        puVar5[1] = 0;
        *(undefined1 *)psVar7 = 0;
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,
                            local_2c0._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8,local_1d8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        _Var14._M_p = local_1c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_001ca99d;
        goto LAB_001ca9a5;
      }
      if (local_260 != 0 || 9 < local_25f) {
        local_1f0 = this->_version + 1;
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadBootStrap",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x185a);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a0,
                   "Unsupported version {}.{}.{}. TinyUSDZ supports version up to 0.9.0","");
        fmt::format<unsigned_char,unsigned_char,unsigned_char>
                  (&local_2c0,(fmt *)&local_2a0,(string *)this,local_1f0,this->_version + 2,in_R9);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,
                            local_2c0._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p == &local_2c0.field_2) goto LAB_001ca709;
        goto LAB_001ca6fc;
      }
      ret = &this->_toc_offset;
      this->_toc_offset = 0;
      bVar3 = StreamReader::read8(this_00,ret);
      if (bVar3) {
        if ((0x58 < *ret) && (*ret < (long)this->_sr->length_)) {
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadBootStrap",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1865);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        ::std::__cxx11::to_string(&local_230,*ret);
        ::std::operator+(&local_258,"Invalid TOC offset value: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_230);
        puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_258);
        psVar7 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_280.field_2._M_allocated_capacity = *psVar7;
          local_280.field_2._8_8_ = puVar5[3];
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar7;
          local_280._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_280._M_string_length = puVar5[1];
        *puVar5 = psVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        ::std::__cxx11::to_string(&local_1c8,this->_sr->length_);
        ::std::operator+(&local_2a0,&local_280,&local_1c8);
        plVar6 = (long *)::std::__cxx11::string::append((char *)&local_2a0);
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_2c0.field_2._M_allocated_capacity = *psVar7;
          local_2c0.field_2._8_8_ = plVar6[3];
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *psVar7;
          local_2c0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2c0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,
                            local_2c0._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        local_1c8.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity;
        _Var14._M_p = local_230._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_001ca99d;
        goto LAB_001ca9a5;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadBootStrap",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x185f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar11 = "Failed to read TOC offset.";
      lVar9 = 0x1a;
      goto LAB_001ca6a8;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadBootStrap",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x183b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    local_280.field_2._M_allocated_capacity = local_238;
    local_280._M_string_length = 8;
    local_280.field_2._8_8_ = local_280.field_2._8_8_ & 0xffffffffffffff00;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,0x3b9e71);
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_2a0.field_2._M_allocated_capacity = *puVar8;
      local_2a0.field_2._8_8_ = plVar6[3];
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    }
    else {
      local_2a0.field_2._M_allocated_capacity = *puVar8;
      local_2a0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_2a0._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_2a0);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2c0.field_2._M_allocated_capacity = *psVar7;
      local_2c0.field_2._8_8_ = plVar6[3];
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    }
    else {
      local_2c0.field_2._M_allocated_capacity = *psVar7;
      local_2c0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_2c0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    local_1c8.field_2._M_allocated_capacity = local_280.field_2._M_allocated_capacity;
    _Var14._M_p = local_280._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
LAB_001ca99d:
      operator_delete(_Var14._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
LAB_001ca9a5:
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p == &local_2c0.field_2) goto LAB_001ca709;
  }
  else {
LAB_001ca607:
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadBootStrap",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    iVar10 = 0x1835;
LAB_001ca683:
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,iVar10);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar11 = "Failed to read magic number.";
    lVar9 = 0x1c;
LAB_001ca6a8:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,lVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p == &local_2c0.field_2) goto LAB_001ca709;
  }
LAB_001ca6fc:
  operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
LAB_001ca709:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadBootStrap() {
  // parse header.
  uint8_t magic[8];
  if (8 != _sr->read(/* req */ 8, /* dst len */ 8, magic)) {
    PUSH_ERROR("Failed to read magic number.");
    return false;
  }

  if (memcmp(magic, "PXR-USDC", 8)) {
    PUSH_ERROR("Invalid magic number. Expected 'PXR-USDC' but got '" +
               std::string(magic, magic + 8) + "'");
    return false;
  }

  // parse version(first 3 bytes from 8 bytes)
  uint8_t version[8];
  if (8 != _sr->read(8, 8, version)) {
    PUSH_ERROR("Failed to read magic number.");
    return false;
  }

  DCOUT("version = " << int(version[0]) << "." << int(version[1]) << "."
                     << int(version[2]));

  _version[0] = version[0];
  _version[1] = version[1];
  _version[2] = version[2];

  // We only support version 0.4.0 or later.
  if ((version[0] == 0) && (version[1] < 4)) {
    PUSH_ERROR("Version must be 0.4.0 or later, but got " +
               std::to_string(version[0]) + "." + std::to_string(version[1]) +
               "." + std::to_string(version[2]));
    return false;
  }

  // Currently up to 0.9.0
  if ((version[0] == 0) && (version[1] < 10)) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Unsupported version {}.{}.{}. TinyUSDZ supports version up to 0.9.0",
      _version[0], _version[1], _version[2]));
  }

  _toc_offset = 0;
  if (!_sr->read8(&_toc_offset)) {
    PUSH_ERROR("Failed to read TOC offset.");
    return false;
  }

  if ((_toc_offset <= 88) || (_toc_offset >= int64_t(_sr->size()))) {
    PUSH_ERROR("Invalid TOC offset value: " + std::to_string(_toc_offset) +
               ", filesize = " + std::to_string(_sr->size()) + ".");
    return false;
  }

  DCOUT("toc offset = " << _toc_offset);

  return true;
}